

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.hpp
# Opt level: O0

void __thiscall duckdb::ArrowRunEndEncodingState::Reset(ArrowRunEndEncodingState *this)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *in_RDI;
  pointer in_stack_ffffffffffffffe8;
  
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::reset
            (in_RDI,in_stack_ffffffffffffffe8);
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::reset
            (in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void Reset() {
		run_ends.reset();
		values.reset();
	}